

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>>::
emplace<QAccessibleInterface*&,QFlags<QAccessible::RelationFlag>const&>
          (QPodArrayOps<std::pair<QAccessibleInterface*,QFlags<QAccessible::RelationFlag>>> *this,
          qsizetype i,QAccessibleInterface **args,QFlags<QAccessible::RelationFlag> *args_1)

{
  Int IVar1;
  int *piVar2;
  long lVar3;
  ulong uVar4;
  QAccessibleInterface *pQVar5;
  pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> *ppVar6;
  GrowthPosition where;
  
  piVar2 = *(int **)this;
  if ((piVar2 == (int *)0x0) || (1 < *piVar2)) {
LAB_0051af58:
    pQVar5 = *args;
    IVar1 = (args_1->super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>).
            super_QFlagsStorage<QAccessible::RelationFlag>.i;
    where = (GrowthPosition)(i == 0 && *(long *)(this + 0x10) != 0);
    QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::
    detachAndGrow((QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
                   *)this,where,1,
                  (pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_> **)0x0,
                  (QArrayDataPointer<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
                   *)0x0);
    ppVar6 = QPodArrayOps<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>::
             createHole((QPodArrayOps<std::pair<QAccessibleInterface_*,_QFlags<QAccessible::RelationFlag>_>_>
                         *)this,where,i,1);
    ppVar6->first = pQVar5;
    (ppVar6->second).super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>.
    super_QFlagsStorage<QAccessible::RelationFlag>.i = IVar1;
    *(undefined4 *)&ppVar6->field_0xc = 0xaaaaaaaa;
  }
  else {
    if ((*(long *)(this + 0x10) == i) &&
       (lVar3 = *(long *)(this + 8),
       *(long *)(piVar2 + 2) !=
       ((long)(lVar3 - ((long)piVar2 + 0x1fU & 0xfffffffffffffff0)) >> 4) + i)) {
      *(QAccessibleInterface **)(lVar3 + i * 0x10) = *args;
      *(Int *)(lVar3 + 8 + i * 0x10) =
           (args_1->super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>).
           super_QFlagsStorage<QAccessible::RelationFlag>.i;
    }
    else {
      if ((i != 0) ||
         (uVar4 = *(ulong *)(this + 8), ((long)piVar2 + 0x1fU & 0xfffffffffffffff0) == uVar4))
      goto LAB_0051af58;
      *(QAccessibleInterface **)(uVar4 - 0x10) = *args;
      *(Int *)(uVar4 - 8) =
           (args_1->super_QFlagsStorageHelper<QAccessible::RelationFlag,_4>).
           super_QFlagsStorage<QAccessible::RelationFlag>.i;
      *(long *)(this + 8) = *(long *)(this + 8) + -0x10;
    }
    *(long *)(this + 0x10) = *(long *)(this + 0x10) + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }